

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O1

void __thiscall
estl::
vector_s<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_30UL>
::destroy_elements(vector_s<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_30UL>
                   *this)

{
  pointer pvVar1;
  long *plVar2;
  long *plVar3;
  size_type sVar4;
  long lVar5;
  
  sVar4 = this->size_;
  if (sVar4 != 0) {
    lVar5 = sVar4 * 0x40 + -0x10;
    do {
      pvVar1 = this->data_ptr_;
      plVar2 = (long *)((long)&(pvVar1->first)._M_dataplus._M_p + lVar5);
      plVar3 = *(long **)((long)pvVar1 + lVar5 + -0x10);
      if (plVar2 != plVar3) {
        operator_delete(plVar3,*plVar2 + 1);
      }
      plVar3 = (long *)((long)pvVar1 + lVar5 + -0x20);
      plVar2 = *(long **)((long)pvVar1 + lVar5 + -0x30);
      if (plVar3 != plVar2) {
        operator_delete(plVar2,*plVar3 + 1);
      }
      sVar4 = sVar4 - 1;
      lVar5 = lVar5 + -0x40;
    } while (sVar4 != 0);
  }
  return;
}

Assistant:

size_type     size        () const noexcept {   return size_;         }